

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O3

vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> * __thiscall
dg::vr::VRLocation::getPredLocations
          (vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>
           *__return_storage_ptr__,VRLocation *this)

{
  pointer *pppVVar1;
  pointer ppVVar2;
  iterator __position;
  pointer ppVVar3;
  
  (__return_storage_ptr__->
  super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVVar2 = (this->predecessors).
            super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar3 = (this->predecessors).
                 super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppVVar3 != ppVVar2; ppVVar3 = ppVVar3 + 1) {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<dg::vr::VRLocation*,std::allocator<dg::vr::VRLocation*>>::
      _M_realloc_insert<dg::vr::VRLocation*const&>
                ((vector<dg::vr::VRLocation*,std::allocator<dg::vr::VRLocation*>> *)
                 __return_storage_ptr__,__position,&(*ppVVar3)->source);
    }
    else {
      *__position._M_current = (*ppVVar3)->source;
      pppVVar1 = &(__return_storage_ptr__->
                  super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppVVar1 = *pppVVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VRLocation *> VRLocation::getPredLocations() {
    std::vector<VRLocation *> result;
    for (VREdge *edge : predecessors) {
        result.push_back(edge->source);
    }
    return result;
}